

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

void __thiscall
gnuplotio::PlotData::
PlotData<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,gnuplotio::Mode1D,gnuplotio::ModeText>
          (PlotData *this,undefined8 arg,string *_plotspec,string *_arr_or_rec)

{
  plotting_empty_container *anon_var_0;
  ostringstream local_4f8 [8];
  ostringstream tmp_2;
  string local_380 [40];
  ostringstream local_358 [8];
  ostringstream tmp_1;
  string local_1e0 [40];
  ostringstream local_1b8 [8];
  ostringstream tmp;
  string *_arr_or_rec_local;
  string *_plotspec_local;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *arg_local;
  PlotData *this_local;
  
  std::__cxx11::string::string((string *)this,_plotspec);
  this->is_text = true;
  this->is_inline = true;
  this->has_data = true;
  std::__cxx11::string::string((string *)&this->data);
  std::__cxx11::string::string((string *)&this->filename);
  std::__cxx11::string::string((string *)&this->arr_or_rec,_arr_or_rec);
  std::__cxx11::string::string((string *)&this->bin_fmt);
  std::__cxx11::string::string((string *)&this->bin_size);
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  top_level_array_sender<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,gnuplotio::Mode1D,gnuplotio::ModeText>
            (local_1b8,arg);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->data,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  if ((this->is_text & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_358);
    top_level_array_sender<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,gnuplotio::Mode1D,gnuplotio::ModeBinfmt>
              (local_358,arg);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)&this->bin_fmt,local_380);
    std::__cxx11::string::~string(local_380);
    std::__cxx11::ostringstream::~ostringstream(local_358);
    std::__cxx11::ostringstream::ostringstream(local_4f8);
    top_level_array_sender<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,gnuplotio::Mode1D,gnuplotio::ModeSize>
              (local_4f8,arg);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)&this->bin_size,(string *)&anon_var_0);
    std::__cxx11::string::~string((string *)&anon_var_0);
    std::__cxx11::ostringstream::~ostringstream(local_4f8);
  }
  return;
}

Assistant:

PlotData(
        const T &arg,
        const std::string &_plotspec,
        const std::string &_arr_or_rec,
        OrganizationMode, PrintMode
    ) :
        plotspec(_plotspec),
        is_text(PrintMode::is_text),
        is_inline(true),
        has_data(true),
        arr_or_rec(_arr_or_rec)
    {
        {
            std::ostringstream tmp;
            top_level_array_sender(tmp, arg, OrganizationMode(), PrintMode());
            data = tmp.str();
        }

        if(!is_text) {
            try {
                {
                    std::ostringstream tmp;
                    top_level_array_sender(tmp, arg, OrganizationMode(), ModeBinfmt());
                    bin_fmt = tmp.str();
                }
                {
                    std::ostringstream tmp;
                    top_level_array_sender(tmp, arg, OrganizationMode(), ModeSize());
                    bin_size = tmp.str();
                }
            } catch(const plotting_empty_container &) {
                bin_fmt = "";
                bin_size = "0";
            }
        }
    }